

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O0

void __thiscall hwnet::TCPConnector::OnActive(TCPConnector *this)

{
  int in_ESI;
  
  OnActive((TCPConnector *)&this[-1].doing,in_ESI);
  return;
}

Assistant:

void TCPConnector::OnActive(int _) {
	(void)_;	

	this->gotError = this->checkError();

	this->poller_->Remove(shared_from_this());

	
	if(auto p = this->connectTimer.lock()) {
		p->cancel();
		this->connectTimer.reset();
	}
	
	auto post = false;
	this->mtx.lock();
	if(!this->doing) {
		post = true;
		this->doing = true;
	}
	this->mtx.unlock();

	if(post) {
		poller_->PostTask(shared_from_this());
	}
}